

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  NodeRef *pNVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  InstancePrimitive *prim;
  ulong unaff_R13;
  size_t mask;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined4 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      pNVar10 = stack + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl((undefined1  [16])aVar2,auVar18);
      auVar27._8_4_ = 0x219392ef;
      auVar27._0_8_ = 0x219392ef219392ef;
      auVar27._12_4_ = 0x219392ef;
      uVar11 = vcmpps_avx512vl(auVar18,auVar27,1);
      bVar17 = (bool)((byte)uVar11 & 1);
      auVar19._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * (int)aVar2.x;
      bVar17 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar19._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * (int)aVar2.y;
      bVar17 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar19._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * (int)aVar2.z;
      bVar17 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar19._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * aVar2.field_3.a;
      auVar18 = vrcp14ps_avx512vl(auVar19);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = &DAT_3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20 = vfnmadd213ps_avx512vl(auVar19,auVar18,auVar20);
      auVar19 = vfmadd132ps_fma(auVar20,auVar18,auVar18);
      fVar21 = auVar19._0_4_;
      auVar33._4_4_ = fVar21;
      auVar33._0_4_ = fVar21;
      auVar33._8_4_ = fVar21;
      auVar33._12_4_ = fVar21;
      auVar33._16_4_ = fVar21;
      auVar33._20_4_ = fVar21;
      auVar33._24_4_ = fVar21;
      auVar33._28_4_ = fVar21;
      auVar18 = vmovshdup_avx(auVar19);
      uVar25 = auVar18._0_8_;
      auVar34._8_8_ = uVar25;
      auVar34._0_8_ = uVar25;
      auVar34._16_8_ = uVar25;
      auVar34._24_8_ = uVar25;
      auVar20 = vshufpd_avx(auVar19,auVar19,1);
      auVar29._8_4_ = 2;
      auVar29._0_8_ = 0x200000002;
      auVar29._12_4_ = 2;
      auVar29._16_4_ = 2;
      auVar29._20_4_ = 2;
      auVar29._24_4_ = 2;
      auVar29._28_4_ = 2;
      auVar5 = vpermps_avx2(auVar29,ZEXT1632(auVar19));
      fVar22 = fVar21 * (ray->org).field_0.m128[0];
      auVar31._8_4_ = 1;
      auVar31._0_8_ = 0x100000001;
      auVar31._12_4_ = 1;
      auVar31._16_4_ = 1;
      auVar31._20_4_ = 1;
      auVar31._24_4_ = 1;
      auVar31._28_4_ = 1;
      auVar23 = ZEXT1632(CONCAT412(auVar19._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar19._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar19._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar22))));
      auVar30 = vpermps_avx2(auVar31,auVar23);
      auVar23 = vpermps_avx2(auVar29,auVar23);
      uVar11 = (ulong)(fVar21 < 0.0) * 0x20;
      uVar12 = (ulong)(auVar18._0_4_ < 0.0) << 5 | 0x40;
      uVar13 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x80;
      auVar26._0_8_ = CONCAT44(fVar22,fVar22) ^ 0x8000000080000000;
      auVar26._8_4_ = -fVar22;
      auVar26._12_4_ = -fVar22;
      auVar26._16_4_ = -fVar22;
      auVar26._20_4_ = -fVar22;
      auVar26._24_4_ = -fVar22;
      auVar26._28_4_ = -fVar22;
      auVar28._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      auVar28._8_4_ = auVar30._8_4_ ^ 0x80000000;
      auVar28._12_4_ = auVar30._12_4_ ^ 0x80000000;
      auVar28._16_4_ = auVar30._16_4_ ^ 0x80000000;
      auVar28._20_4_ = auVar30._20_4_ ^ 0x80000000;
      auVar28._24_4_ = auVar30._24_4_ ^ 0x80000000;
      auVar28._28_4_ = auVar30._28_4_ ^ 0x80000000;
      auVar30._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      auVar30._8_4_ = auVar23._8_4_ ^ 0x80000000;
      auVar30._12_4_ = auVar23._12_4_ ^ 0x80000000;
      auVar30._16_4_ = auVar23._16_4_ ^ 0x80000000;
      auVar30._20_4_ = auVar23._20_4_ ^ 0x80000000;
      auVar30._24_4_ = auVar23._24_4_ ^ 0x80000000;
      auVar30._28_4_ = auVar23._28_4_ ^ 0x80000000;
      uVar24 = auVar3._0_4_;
      auVar23._4_4_ = uVar24;
      auVar23._0_4_ = uVar24;
      auVar23._8_4_ = uVar24;
      auVar23._12_4_ = uVar24;
      auVar23._16_4_ = uVar24;
      auVar23._20_4_ = uVar24;
      auVar23._24_4_ = uVar24;
      auVar23._28_4_ = uVar24;
      auVar32._4_4_ = fVar1;
      auVar32._0_4_ = fVar1;
      auVar32._8_4_ = fVar1;
      auVar32._12_4_ = fVar1;
      auVar32._16_4_ = fVar1;
      auVar32._20_4_ = fVar1;
      auVar32._24_4_ = fVar1;
      auVar32._28_4_ = fVar1;
      do {
        if (pNVar10 == stack) {
          return;
        }
        sVar15 = pNVar10[-1].ptr;
        pNVar10 = pNVar10 + -1;
        do {
          if ((sVar15 & 8) == 0) {
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar15 + 0x40 + uVar11),auVar26,auVar33)
            ;
            auVar18 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar15 + 0x40 + uVar12),auVar28,auVar34
                                     );
            auVar29 = vpmaxsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar18));
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar15 + 0x40 + uVar13),auVar30,auVar5);
            auVar31 = vpmaxsd_avx2(ZEXT1632(auVar3),auVar23);
            auVar29 = vpmaxsd_avx2(auVar29,auVar31);
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar15 + 0x40 + (uVar11 ^ 0x20)),auVar26
                                     ,auVar33);
            auVar18 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar15 + 0x40 + (uVar12 ^ 0x20)),
                                      auVar28,auVar34);
            auVar31 = vpminsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar18));
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar15 + 0x40 + (uVar13 ^ 0x20)),auVar30
                                     ,auVar5);
            auVar4 = vpminsd_avx2(ZEXT1632(auVar3),auVar32);
            auVar31 = vpminsd_avx2(auVar31,auVar4);
            uVar25 = vpcmpd_avx512vl(auVar29,auVar31,2);
            unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)(byte)uVar25);
          }
          if ((sVar15 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar16 = 4;
            }
            else {
              uVar14 = sVar15 & 0xfffffffffffffff0;
              lVar9 = 0;
              for (uVar8 = unaff_R13; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
                lVar9 = lVar9 + 1;
              }
              iVar16 = 0;
              for (uVar8 = unaff_R13 - 1 & unaff_R13; sVar15 = *(size_t *)(uVar14 + lVar9 * 8),
                  uVar8 != 0; uVar8 = uVar8 - 1 & uVar8) {
                pNVar10->ptr = sVar15;
                pNVar10 = pNVar10 + 1;
                lVar9 = 0;
                for (uVar6 = uVar8; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  lVar9 = lVar9 + 1;
                }
              }
            }
          }
          else {
            iVar16 = 6;
          }
        } while (iVar16 == 0);
        if (iVar16 == 6) {
          uVar8 = (ulong)((uint)sVar15 & 0xf);
          iVar16 = 0;
          bVar17 = uVar8 != 8;
          if (bVar17) {
            prim = (InstancePrimitive *)(sVar15 & 0xfffffffffffffff0);
            bVar7 = InstanceIntersector1::occluded(&pre,ray,context,prim);
            if (!bVar7) {
              uVar14 = 0;
              do {
                prim = prim + 1;
                if (uVar8 - 9 == uVar14) goto LAB_0072df31;
                bVar17 = InstanceIntersector1::occluded(&pre,ray,context,prim);
                uVar14 = uVar14 + 1;
              } while (!bVar17);
              bVar17 = uVar14 < uVar8 - 8;
            }
            iVar16 = 0;
            if (bVar17) {
              ray->tfar = -INFINITY;
              iVar16 = 3;
            }
          }
        }
LAB_0072df31:
      } while (iVar16 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }